

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpsprop.c
# Opt level: O3

FT_Error ps_property_get(FT_Module module,char *property_name,void *value)

{
  int iVar1;
  FT_Int *val;
  
  iVar1 = strcmp(property_name,"darkening-parameters");
  if (iVar1 == 0) {
    *(undefined4 *)value = *(undefined4 *)&module[2].memory;
    *(undefined4 *)((long)value + 4) = *(undefined4 *)((long)&module[2].memory + 4);
    *(undefined4 *)((long)value + 8) = *(undefined4 *)&module[3].clazz;
    *(undefined4 *)((long)value + 0xc) = *(undefined4 *)((long)&module[3].clazz + 4);
    *(undefined4 *)((long)value + 0x10) = *(undefined4 *)&module[3].library;
    *(undefined4 *)((long)value + 0x14) = *(undefined4 *)((long)&module[3].library + 4);
    *(undefined4 *)((long)value + 0x18) = *(undefined4 *)&module[3].memory;
    *(undefined4 *)((long)value + 0x1c) = *(undefined4 *)((long)&module[3].memory + 4);
  }
  else {
    iVar1 = strcmp(property_name,"hinting-engine");
    if (iVar1 == 0) {
      *(undefined4 *)value = *(undefined4 *)&module[2].library;
    }
    else {
      iVar1 = strcmp(property_name,"no-stem-darkening");
      if (iVar1 != 0) {
        return 0xc;
      }
      *(undefined1 *)value = *(undefined1 *)((long)&module[2].library + 4);
    }
  }
  return 0;
}

Assistant:

FT_BASE_CALLBACK_DEF( FT_Error )
  ps_property_get( FT_Module    module,         /* PS_Driver */
                   const char*  property_name,
                   void*        value )
  {
    FT_Error   error  = FT_Err_Ok;
    PS_Driver  driver = (PS_Driver)module;


    if ( !ft_strcmp( property_name, "darkening-parameters" ) )
    {
      FT_Int*  darken_params = driver->darken_params;
      FT_Int*  val           = (FT_Int*)value;


      val[0] = darken_params[0];
      val[1] = darken_params[1];
      val[2] = darken_params[2];
      val[3] = darken_params[3];
      val[4] = darken_params[4];
      val[5] = darken_params[5];
      val[6] = darken_params[6];
      val[7] = darken_params[7];

      return error;
    }

    else if ( !ft_strcmp( property_name, "hinting-engine" ) )
    {
      FT_UInt   hinting_engine    = driver->hinting_engine;
      FT_UInt*  val               = (FT_UInt*)value;


      *val = hinting_engine;

      return error;
    }

    else if ( !ft_strcmp( property_name, "no-stem-darkening" ) )
    {
      FT_Bool   no_stem_darkening = driver->no_stem_darkening;
      FT_Bool*  val               = (FT_Bool*)value;


      *val = no_stem_darkening;

      return error;
    }

    FT_TRACE0(( "ps_property_get: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }